

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall Polymer::~Polymer(Polymer *this)

{
  Polymer *this_local;
  
  this->_vptr_Polymer = (_func_int **)&PTR_Initialize_002aa5b8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map(&this->uncovered_);
  Mask::~Mask(&this->mask_);
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::~IntervalTree(&this->release_sites_);
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::~IntervalTree(&this->binding_sites_);
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::~vector(&this->release_intervals_);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector(&this->binding_intervals_);
  MobileElementManager::~MobileElementManager(&this->polymerases_);
  std::__cxx11::string::~string((string *)&this->name_);
  std::weak_ptr<PolymerWrapper>::~weak_ptr(&this->wrapper_);
  Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~Signal(&this->termination_signal_);
  std::enable_shared_from_this<Polymer>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<Polymer>);
  return;
}

Assistant:

Polymer::~Polymer() {
  // The following code can be uncommented to check that
  // polymers are being properly destroyed during the simulation,
  // i.e. nothing is left uncovered/ no polymerases are bound. 
  // For debugging purposes only. 
  //
  /*std::cout << "Begin destroying polymer." << std::endl;
  if (polymerases_.pol_count() != 0) {
    std::cout << "WARNING: Attempting to destruct Polymer object with "
                 "Polymerases still "
                 "attached. Total propensity of polymer: " +
                     std::to_string(polymerases_.prop_sum())
              << std::endl;
  }
  for (auto const &site : uncovered_) {
    if (site.second != 0) {
      if (site.first == "__rnase_site" || site.first == "__rnase_site_ext") {
        LogCover(site.first);
      } else {
        std::cout << "WARNING: Attempting to destruct Polymer object with "
                     "uncovered binding "
                     "sites. Binding site name: " +
                         site.first
                  << std::endl;
      }
    }
  }*/
}